

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall cmFindLibraryHelper::AddName(cmFindLibraryHelper *this,string *name)

{
  cmFindLibraryHelper *this_00;
  string regex;
  Name entry;
  allocator local_129;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  pointer local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  RegularExpression local_e0;
  
  local_100._M_p = (pointer)&local_f0;
  local_108[0] = false;
  local_f8 = (pointer)0x0;
  local_f0._M_local_buf[0] = '\0';
  local_e0.program = (char *)0x0;
  local_108[0] = HasValidSuffix(this,name);
  std::__cxx11::string::_M_assign((string *)&local_100);
  std::__cxx11::string::string((string *)local_128,"^",&local_129);
  this_00 = (cmFindLibraryHelper *)local_128;
  std::__cxx11::string::append((string *)this_00);
  RegexFromLiteral(this_00,(string *)local_128,name);
  std::__cxx11::string::append((string *)local_128);
  if (this->OpenBSD == true) {
    std::__cxx11::string::append(local_128);
  }
  std::__cxx11::string::append(local_128);
  cmsys::RegularExpression::compile(&local_e0,(char *)local_128._0_8_);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::push_back
            (&this->Names,(value_type *)local_108);
  std::__cxx11::string::~string((string *)local_128);
  Name::~Name((Name *)local_108);
  return;
}

Assistant:

void cmFindLibraryHelper::AddName(std::string const& name)
{
  Name entry;

  // Consider checking the raw name too.
  entry.TryRaw = this->HasValidSuffix(name);
  entry.Raw = name;

  // Build a regular expression to match library names.
  std::string regex = "^";
  regex += this->PrefixRegexStr;
  this->RegexFromLiteral(regex, name);
  regex += this->SuffixRegexStr;
  if(this->OpenBSD)
    {
    regex += "(\\.[0-9]+\\.[0-9]+)?";
    }
  regex += "$";
  entry.Regex.compile(regex.c_str());
  this->Names.push_back(entry);
}